

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int encode(uint8_t *in,uint64_t *out,size_t l,uint64_t q)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  size_t by;
  long lVar4;
  uint8_t uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (out == (uint64_t *)0x0 || in == (uint8_t *)0x0) {
    return -1;
  }
  uVar3 = l >> 3;
  uVar1 = l & 7;
  for (lVar4 = 0; lVar4 != (uVar3 + 1) - (ulong)(uVar1 == 0); lVar4 = lVar4 + 1) {
    uVar5 = in[lVar4];
    uVar6 = 8;
    if (l < 8) {
      uVar6 = l;
    }
    for (uVar2 = 0; uVar6 != uVar2; uVar2 = uVar2 + 1) {
      uVar7 = q >> 1;
      if (-1 < (char)uVar5) {
        uVar7 = 0;
      }
      out[uVar2] = uVar7;
      uVar5 = uVar5 * '\x02';
    }
    l = l - uVar2;
    out = out + 8;
  }
  return 0;
}

Assistant:

int encode(uint8_t in[], uint64_t out[], size_t l, uint64_t q) {
    if(in == NULL || out == NULL)
        return -1;

    // define possible encoding values
    uint64_t low = 0;
    uint64_t high = q/2;

    // calculate number of bytes
    size_t num_bytes = l/8;
    if(num_bytes * 8 != l)
        num_bytes++;

    // iterate over bytes and bits and encode input
    for(size_t by = 0; by < num_bytes; by++) {
        uint8_t byte = in[by];
        for(size_t bi = 0; bi < 8 && l > 0; bi++) {
            out[by*8+bi] = (byte & 0x80) ? high : low;
            byte <<= 1;
            l--;
        }
    }

    return 0;
}